

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_ESI;
  uint in_EDI;
  bool is_open;
  char name [20];
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003c4;
  bool *in_stack_000003c8;
  char *in_stack_000003d0;
  char local_38 [4];
  ImGuiPopupFlags in_stack_ffffffffffffffcc;
  ImGuiID in_stack_ffffffffffffffd0;
  bool local_1;
  
  pIVar1 = GImGui;
  bVar2 = IsPopupOpen(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (bVar2) {
    if ((in_ESI & 0x10000000) == 0) {
      ImFormatString(local_38,0x14,"##Popup_%08x",(ulong)in_EDI);
    }
    else {
      ImFormatString(local_38,0x14,"##Menu_%02d",(ulong)(uint)pIVar1->BeginMenuCount);
    }
    local_1 = Begin(in_stack_000003d0,in_stack_000003c8,in_stack_000003c4);
    if (!local_1) {
      EndPopup();
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&pIVar1->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginMenuCount); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    flags |= ImGuiWindowFlags_Popup;
    bool is_open = Begin(name, NULL, flags);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}